

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O1

Matrix4x4 * __thiscall
CMU462::Matrix4x4::operator+(Matrix4x4 *__return_storage_ptr__,Matrix4x4 *this,Matrix4x4 *B)

{
  Matrix4x4 *pMVar1;
  int i;
  long lVar2;
  Matrix4x4 *A;
  Matrix4x4 *C;
  long lVar3;
  
  pMVar1 = __return_storage_ptr__;
  __return_storage_ptr__->entries[3].z = 0.0;
  __return_storage_ptr__->entries[3].w = 0.0;
  __return_storage_ptr__->entries[3].x = 0.0;
  __return_storage_ptr__->entries[3].y = 0.0;
  __return_storage_ptr__->entries[2].z = 0.0;
  __return_storage_ptr__->entries[2].w = 0.0;
  __return_storage_ptr__->entries[2].x = 0.0;
  __return_storage_ptr__->entries[2].y = 0.0;
  __return_storage_ptr__->entries[1].z = 0.0;
  __return_storage_ptr__->entries[1].w = 0.0;
  __return_storage_ptr__->entries[1].x = 0.0;
  __return_storage_ptr__->entries[1].y = 0.0;
  __return_storage_ptr__->entries[0].z = 0.0;
  __return_storage_ptr__->entries[0].w = 0.0;
  __return_storage_ptr__->entries[0].x = 0.0;
  __return_storage_ptr__->entries[0].y = 0.0;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      *(double *)((long)__return_storage_ptr__ + lVar3) =
           *(double *)((long)this + lVar3) + *(double *)((long)B + lVar3);
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0x80);
    lVar2 = lVar2 + 1;
    this = (Matrix4x4 *)((long)this + 8);
    B = (Matrix4x4 *)((long)B + 8);
    __return_storage_ptr__ = (Matrix4x4 *)((long)__return_storage_ptr__ + 8);
  } while (lVar2 != 4);
  return pMVar1;
}

Assistant:

Matrix4x4 Matrix4x4::operator+( const Matrix4x4& B ) const {
    const Matrix4x4& A( *this );
    Matrix4x4 C;

    for( int i = 0; i < 4; i++ )
    for( int j = 0; j < 4; j++ )
    {
       C(i,j) = A(i,j) + B(i,j);
    }

    return C;
  }